

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructSerializer.hpp
# Opt level: O0

size_t mserialize::
       StructSerializer<binlog::ClockSync,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::clockValue>,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::clockFrequency>,_std::integral_constant<unsigned_long_binlog::ClockSync::*,_&binlog::ClockSync::nsSinceEpoch>,_std::integral_constant<int_binlog::ClockSync::*,_&binlog::ClockSync::tzOffset>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::ClockSync::*,_&binlog::ClockSync::tzName>_>
       ::serialized_size(ClockSync *t)

{
  size_t s;
  size_t *__end0;
  size_t *__begin0;
  size_t (*__range2) [6];
  size_t result;
  size_t field_sizes [6];
  value_type in_stack_ffffffffffffff98;
  ClockSync *in_stack_ffffffffffffffa0;
  long *local_50;
  size_t local_40;
  long local_38;
  size_t local_30;
  size_t local_28;
  size_t local_20;
  size_t local_18;
  long local_8;
  
  local_38 = 0;
  local_30 = StructSerializer<binlog::ClockSync,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::clockValue>,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::clockFrequency>,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::nsSinceEpoch>,std::integral_constant<int_binlog::ClockSync::*,&binlog::ClockSync::tzOffset>,std::integral_constant<std::__cxx11::string_binlog::ClockSync::*,&binlog::ClockSync::tzName>>
             ::serialized_size_member<binlog::ClockSync,unsigned_long>
                       (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  local_28 = StructSerializer<binlog::ClockSync,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::clockValue>,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::clockFrequency>,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::nsSinceEpoch>,std::integral_constant<int_binlog::ClockSync::*,&binlog::ClockSync::tzOffset>,std::integral_constant<std::__cxx11::string_binlog::ClockSync::*,&binlog::ClockSync::tzName>>
             ::serialized_size_member<binlog::ClockSync,unsigned_long>
                       (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  local_20 = StructSerializer<binlog::ClockSync,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::clockValue>,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::clockFrequency>,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::nsSinceEpoch>,std::integral_constant<int_binlog::ClockSync::*,&binlog::ClockSync::tzOffset>,std::integral_constant<std::__cxx11::string_binlog::ClockSync::*,&binlog::ClockSync::tzName>>
             ::serialized_size_member<binlog::ClockSync,unsigned_long>
                       (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  local_18 = StructSerializer<binlog::ClockSync,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::clockValue>,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::clockFrequency>,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::nsSinceEpoch>,std::integral_constant<int_binlog::ClockSync::*,&binlog::ClockSync::tzOffset>,std::integral_constant<std::__cxx11::string_binlog::ClockSync::*,&binlog::ClockSync::tzName>>
             ::serialized_size_member<binlog::ClockSync,int>
                       (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  StructSerializer<binlog::ClockSync,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::clockValue>,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::clockFrequency>,std::integral_constant<unsigned_long_binlog::ClockSync::*,&binlog::ClockSync::nsSinceEpoch>,std::integral_constant<int_binlog::ClockSync::*,&binlog::ClockSync::tzOffset>,std::integral_constant<std::__cxx11::string_binlog::ClockSync::*,&binlog::ClockSync::tzName>>
  ::serialized_size_member<binlog::ClockSync,std::__cxx11::string>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  local_40 = 0;
  for (local_50 = &local_38; local_50 != &local_8; local_50 = local_50 + 1) {
    local_40 = *local_50 + local_40;
  }
  return local_40;
}

Assistant:

static std::size_t serialized_size(const T& t)
  {
    const std::size_t field_sizes[] = {0, serialized_size_member(t, Members::value)...};

    std::size_t result = 0;
    for (auto s : field_sizes) { result += s; }
    return result;
  }